

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::get_value(value *__return_storage_ptr__,impl *this,value *v)

{
  bool bVar1;
  value_type vVar2;
  object_ptr *p;
  string *psVar3;
  wostream *pwVar4;
  native_error_exception *this_00;
  object *poVar5;
  wstring_view local_268;
  undefined1 local_251;
  wstring local_250 [32];
  wstring_view local_230;
  wstring local_220;
  wstring_view local_200;
  wstring_view local_1f0;
  wstring local_1e0;
  wostringstream local_1b0 [8];
  wostringstream woss;
  undefined1 local_38 [8];
  object_ptr b;
  reference *r;
  value *v_local;
  impl *this_local;
  
  vVar2 = value::type(v);
  if (vVar2 == reference) {
    b.super_gc_heap_ptr_untyped._8_8_ = value::reference_value(v);
    p = reference::base((reference *)b.super_gc_heap_ptr_untyped._8_8_);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_38,p);
    bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)local_38);
    if (!bVar1) {
      std::__cxx11::wostringstream::wostringstream(local_1b0);
      psVar3 = reference::property_name((reference *)b.super_gc_heap_ptr_untyped._8_8_);
      local_1f0 = string::view(psVar3);
      cpp_quote_abi_cxx11_(&local_1e0,(mjs *)&local_1f0,(wstring_view *)local_1f0._M_str);
      pwVar4 = std::operator<<((wostream *)local_1b0,(wstring *)&local_1e0);
      std::operator<<(pwVar4," is not defined");
      std::__cxx11::wstring::~wstring((wstring *)&local_1e0);
      local_251 = 1;
      this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_220,this);
      local_200 = (wstring_view)
                  std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_220);
      std::__cxx11::wostringstream::str();
      local_230 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_250)
      ;
      native_error_exception::native_error_exception(this_00,reference,&local_200,&local_230);
      local_251 = 0;
      __cxa_throw(this_00,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_38);
    psVar3 = reference::property_name((reference *)b.super_gc_heap_ptr_untyped._8_8_);
    local_268 = string::view(psVar3);
    (**poVar5->_vptr_object)(__return_storage_ptr__,poVar5,&local_268);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_38);
  }
  else {
    value::value(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

value get_value(const value& v) const {
        if (v.type() != value_type::reference) {
            return v;
        }
        auto& r = v.reference_value();
        auto b = r.base();
        if (!b) {
            std::wostringstream woss;
            woss << cpp_quote(r.property_name().view()) << " is not defined";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }
        return b->get(r.property_name().view());
    }